

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O1

void __thiscall
CStructure::CopyMember(CStructure *this,CStructureEntry2 *item,aint newDefault,EType newDeltaType)

{
  int iVar1;
  int iVar2;
  EStructureMembers EVar3;
  CStructureEntry2 *pCVar4;
  CStructureEntry2 *pCVar5;
  
  pCVar4 = (CStructureEntry2 *)operator_new(0x28);
  iVar1 = this->noffset;
  iVar2 = item->len;
  EVar3 = item->type;
  pCVar4->next = (CStructureEntry2 *)0x0;
  pCVar4->text = (byte *)0x0;
  pCVar4->offset = iVar1;
  pCVar4->len = iVar2;
  pCVar4->def = newDefault;
  pCVar4->defDeltaType = newDeltaType;
  pCVar4->type = EVar3;
  if (this->mbf == (CStructureEntry2 *)0x0) {
    pCVar5 = (CStructureEntry2 *)&this->mbf;
  }
  else {
    pCVar5 = this->mbl;
  }
  pCVar5->next = pCVar4;
  this->mbl = pCVar4;
  this->noffset = iVar2 + iVar1;
  return;
}

Assistant:

void CStructure::CopyMember(CStructureEntry2* item, aint newDefault, Relocation::EType newDeltaType) {
	AddMember(new CStructureEntry2(noffset, item->len, newDefault, newDeltaType, item->type));
}